

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O3

Type * __thiscall
mnf::Manifold::getView<0,1>
          (Type *__return_storage_ptr__,Manifold *this,RefMat *val,size_t ir,size_t ic)

{
  PointerType pdVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_01;
  ulong uVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar6;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  iVar3 = (*this->_vptr_Manifold[7])(this);
  if (CONCAT44(extraout_var,iVar3) <= ir) {
    __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1b5,"Index mnf::Manifold::getStart(size_t) const");
  }
  iVar3 = (*this->_vptr_Manifold[0xf])(this,ir);
  uVar4 = CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*this->_vptr_Manifold[7])(this);
  if (CONCAT44(extraout_var_01,iVar3) <= ic) {
    __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1bc,"Index mnf::Manifold::getStart(size_t) const");
  }
  iVar3 = (*this->_vptr_Manifold[0x10])(this,ic);
  uVar5 = CONCAT44(extraout_var_02,iVar3);
  iVar3 = (*this->_vptr_Manifold[7])(this);
  if (CONCAT44(extraout_var_03,iVar3) <= ir) {
    __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1cf,"Index mnf::Manifold::getDim(size_t) const");
  }
  iVar3 = (*this->_vptr_Manifold[8])(this,ir);
  uVar6 = representationDim((Manifold *)CONCAT44(extraout_var_04,iVar3));
  iVar3 = (*this->_vptr_Manifold[7])(this);
  if (ic < CONCAT44(extraout_var_05,iVar3)) {
    iVar3 = (*this->_vptr_Manifold[8])(this,ic);
    uVar7 = tangentDim((Manifold *)CONCAT44(extraout_var_06,iVar3));
    pdVar1 = (val->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
    lVar2 = (val->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).m_stride.m_outer.m_value;
    (__return_storage_ptr__->
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    ).
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
    .m_data = pdVar1 + uVar4 + lVar2 * uVar5;
    (__return_storage_ptr__->
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    ).
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
    .m_rows.m_value = uVar6;
    (__return_storage_ptr__->
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    ).
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
    .m_cols.m_value = uVar7;
    if ((long)(uVar7 | uVar6) < 0 && pdVar1 != (PointerType)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>>, Level = 0]"
                   );
    }
    (__return_storage_ptr__->
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    ).
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .m_xpr = val;
    (__return_storage_ptr__->
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    ).
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .m_startRow.m_value = uVar4;
    (__return_storage_ptr__->
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    ).
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .m_startCol.m_value = uVar5;
    (__return_storage_ptr__->
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    ).
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .m_outerStride = lVar2;
    if ((((-1 < (long)(uVar6 | uVar4)) && (-1 < (long)(uVar7 | uVar5))) &&
        ((long)uVar4 <=
         (long)((val->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value - uVar6))) &&
       ((long)uVar5 <=
        (long)((val->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value - uVar7))) {
      return __return_storage_ptr__;
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                ,0x1d6,"Index mnf::Manifold::getDim(size_t) const");
}

Assistant:

inline typename ViewReturnType<Dr, Dc>::Type Manifold::getView(RefMat val,
                                                               size_t ir,
                                                               size_t ic) const
{
  return val.block(getStart<Dr>(ir), getStart<Dc>(ic), getDim<Dr>(ir),
                   getDim<Dc>(ic));
}